

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_begin(BEGIN_HANDLE begin)

{
  AMQP_VALUE pAVar1;
  
  if (begin != (BEGIN_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(begin->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_begin(BEGIN_HANDLE begin)
{
    AMQP_VALUE result;

    if (begin == NULL)
    {
        result = NULL;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        result = amqpvalue_clone(begin_instance->composite_value);
    }

    return result;
}